

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_gcd_into(mp_int *a,mp_int *b,mp_int *gcd,mp_int *A,mp_int *B)

{
  size_t sVar1;
  mp_int *pmVar2;
  BignumInt BVar3;
  BignumInt BVar4;
  mp_int *b_in;
  ulong uVar5;
  mp_int *bs;
  mp_int *as;
  size_t shift;
  BignumDblInt ADC_temp;
  BignumInt negw;
  size_t i_1;
  BignumCarry carry;
  size_t i;
  mp_int *tmp;
  mp_int *B_local;
  mp_int *A_local;
  mp_int *gcd_local;
  mp_int *b_local;
  mp_int *a_local;
  
  sVar1 = size_t_max(a->nw,b->nw);
  pmVar2 = mp_make_sized(sVar1);
  for (carry = 0; carry < pmVar2->nw; carry = carry + 1) {
    BVar3 = mp_word(a,carry);
    BVar4 = mp_word(b,carry);
    pmVar2->w[carry] = BVar3 | BVar4;
  }
  i_1 = 1;
  for (negw = 0; negw < pmVar2->nw; negw = negw + 1) {
    uVar5 = ~pmVar2->w[negw] + i_1;
    i_1 = (size_t)CARRY8(~pmVar2->w[negw],i_1);
    pmVar2->w[negw] = uVar5 & pmVar2->w[negw];
  }
  sVar1 = mp_get_nbits(pmVar2);
  sVar1 = sVar1 - 1;
  mp_free(pmVar2);
  pmVar2 = mp_rshift_safe(a,sVar1);
  b_in = mp_rshift_safe(b,sVar1);
  mp_bezout_into(A,B,gcd,pmVar2,b_in);
  mp_free(pmVar2);
  mp_free(b_in);
  if (gcd != (mp_int *)0x0) {
    mp_lshift_safe_in_place(gcd,sVar1);
  }
  return;
}

Assistant:

void mp_gcd_into(mp_int *a, mp_int *b, mp_int *gcd, mp_int *A, mp_int *B)
{
    /*
     * Identify shared factors of 2. To do this we OR the two numbers
     * to get something whose lowest set bit is in the right place,
     * remove all higher bits by ANDing it with its own negation, and
     * use mp_get_nbits to find the location of the single remaining
     * set bit.
     */
    mp_int *tmp = mp_make_sized(size_t_max(a->nw, b->nw));
    for (size_t i = 0; i < tmp->nw; i++)
        tmp->w[i] = mp_word(a, i) | mp_word(b, i);
    BignumCarry carry = 1;
    for (size_t i = 0; i < tmp->nw; i++) {
        BignumInt negw;
        BignumADC(negw, carry, 0, ~tmp->w[i], carry);
        tmp->w[i] &= negw;
    }
    size_t shift = mp_get_nbits(tmp) - 1;
    mp_free(tmp);

    /*
     * Make copies of a,b with those shared factors of 2 divided off,
     * so that at least one is odd (which is the precondition for
     * mp_bezout_into). Compute the gcd of those.
     */
    mp_int *as = mp_rshift_safe(a, shift);
    mp_int *bs = mp_rshift_safe(b, shift);
    mp_bezout_into(A, B, gcd, as, bs);
    mp_free(as);
    mp_free(bs);

    /*
     * And finally shift the gcd back up (unless the caller didn't
     * even ask for it), to put the shared factors of 2 back in.
     */
    if (gcd)
        mp_lshift_safe_in_place(gcd, shift);
}